

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_softsynth_mididevice.cpp
# Opt level: O0

int __thiscall
SoftSynthMIDIDevice::OpenStream
          (SoftSynthMIDIDevice *this,int chunks,int flags,
          _func_void_uint_void_ptr_DWORD_DWORD *callback,void *userdata)

{
  int iVar1;
  undefined4 extraout_var;
  uint local_34;
  int chunksize;
  void *userdata_local;
  _func_void_uint_void_ptr_DWORD_DWORD *callback_local;
  int flags_local;
  int chunks_local;
  SoftSynthMIDIDevice *this_local;
  
  iVar1 = this->SampleRate / chunks;
  local_34 = iVar1 << 2;
  if ((flags & 1U) == 0) {
    local_34 = iVar1 << 3;
  }
  iVar1 = (*GSnd->_vptr_SoundRenderer[0xb])
                    (GSnd,FillStream,(ulong)local_34,(ulong)(flags | 8),
                     (ulong)(uint)this->SampleRate);
  this->Stream = (SoundStream *)CONCAT44(extraout_var,iVar1);
  if (this->Stream == (SoundStream *)0x0) {
    this_local._4_4_ = 2;
  }
  else {
    this->Callback = callback;
    this->CallbackData = userdata;
    this->Tempo = 500000.0;
    this->Division = 100.0;
    (*(this->super_MIDIDevice)._vptr_MIDIDevice[0x19])();
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int SoftSynthMIDIDevice::OpenStream(int chunks, int flags, void (*callback)(unsigned int, void *, DWORD, DWORD), void *userdata)
{
	int chunksize = (SampleRate / chunks) * 4;
	if (!(flags & SoundStream::Mono))
	{
		chunksize *= 2;
	}
	Stream = GSnd->CreateStream(FillStream, chunksize, SoundStream::Float | flags, SampleRate, this);
	if (Stream == NULL)
	{
		return 2;
	}

	Callback = callback;
	CallbackData = userdata;
	Tempo = 500000;
	Division = 100;
	CalcTickRate();
	return 0;
}